

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O2

bool dxil_spv::emit_wmma_load(Impl *impl)

{
  uint32_t immediate;
  bool bVar1;
  Id type_id;
  Id arg;
  Builder *this;
  Value *pVVar2;
  Value *stride;
  Operation *this_00;
  LoggingCallback p_Var3;
  void *pvVar4;
  char *__ptr;
  WMMAAccessChain WVar5;
  size_t sStack_1050;
  char buffer [4096];
  
  this = Converter::Impl::builder(impl);
  pVVar2 = LLVMBC::Instruction::getOperand
                     (&(impl->ags).backdoor_instructions[1]->super_Instruction,5);
  if (pVVar2 != (impl->ags).active_read_backdoor) {
    return false;
  }
  if ((impl->ags).instructions[0].phase != 0) {
    return false;
  }
  if ((impl->ags).instructions[1].phase != 1) {
    return false;
  }
  immediate = (impl->ags).instructions[1].immediate;
  type_id = build_coopmat_type(impl,immediate);
  if (type_id == 0) {
    p_Var3 = get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      __ptr = "[ERROR]: Failed to create coopmat type.\n";
      sStack_1050 = 0x28;
      goto LAB_0016d176;
    }
    builtin_strncpy(buffer + 0x10," coopmat type.\n",0x10);
    builtin_strncpy(buffer + 8,"o create",8);
  }
  else {
    pVVar2 = LLVMBC::Instruction::getOperand
                       (&(impl->ags).backdoor_instructions[0]->super_Instruction,5);
    stride = LLVMBC::Instruction::getOperand
                       (&(impl->ags).backdoor_instructions[0]->super_Instruction,6);
    WVar5 = build_wmma_access_chain(impl,pVVar2,stride);
    if (WVar5.chain_id == 0) {
      return false;
    }
    if ((impl->ags).active_uav_op == AtomicBinOp) {
      emit_subgroup_barrier(impl);
    }
    this_00 = Converter::Impl::allocate(impl,OpCooperativeMatrixLoadKHR,type_id);
    Operation::add_id(this_00,WVar5.chain_id);
    arg = spv::Builder::makeUintConstant(this,immediate >> 7 & 1,false);
    Operation::add_id(this_00,arg);
    Operation::add_id(this_00,WVar5.stride_id);
    if (WVar5.alignment != 0) {
      Operation::add_literal(this_00,2);
      Operation::add_literal(this_00,WVar5.alignment);
    }
    Converter::Impl::add(impl,this_00,false);
    if ((impl->ags).active_uav_op == AtomicBinOp) {
      emit_subgroup_barrier(impl);
    }
    bVar1 = emit_wmma_return_values(impl,type_id,this_00->id,2);
    if (bVar1) {
      return true;
    }
    p_Var3 = get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      __ptr = "[ERROR]: Failed to emit WMMA return values.\n";
      sStack_1050 = 0x2c;
LAB_0016d176:
      fwrite(__ptr,sStack_1050,1,_stderr);
      fflush(_stderr);
      return false;
    }
    builtin_strncpy(buffer + 8,"o emit WMMA return values.\n",0x1c);
  }
  builtin_strncpy(buffer,"Failed t",8);
  pvVar4 = get_thread_log_callback_userdata();
  (*p_Var3)(pvVar4,Error,buffer);
  return false;
}

Assistant:

static bool emit_wmma_load(Converter::Impl &impl)
{
	auto &builder = impl.builder();

	// Sanity check that we're reading from the hooked read opcode.
	if (impl.ags.backdoor_instructions[1]->getOperand(5) != impl.ags.active_read_backdoor)
		return false;

	if (impl.ags.instructions[0].phase != 0)
		return false;
	if (impl.ags.instructions[1].phase != 1)
		return false;

	uint32_t type_immediate = impl.ags.instructions[1].immediate;
	spv::Id type_id = build_coopmat_type(impl, type_immediate);

	if (!type_id)
	{
		LOGE("Failed to create coopmat type.\n");
		return false;
	}

	auto chain = build_wmma_access_chain(impl, impl.ags.backdoor_instructions[0]->getOperand(5),
	                                     impl.ags.backdoor_instructions[0]->getOperand(6));

	if (chain.chain_id == 0)
		return false;

	bool column_major = ((type_immediate >> AmdExtD3DShaderIntrinsicsWaveMatrixModifier_LayoutFlagShift) &
	                     AmdExtD3DShaderIntrinsicsWaveMatrixModifier_LayoutFlagMask) != 0;

	// Workaround AGS omitting barriers.
	if (impl.ags.active_uav_op == DXIL::Op::AtomicBinOp)
		emit_subgroup_barrier(impl);

	auto *load = impl.allocate(spv::OpCooperativeMatrixLoadKHR, type_id);
	load->add_id(chain.chain_id);
	load->add_id(builder.makeUintConstant(
		column_major ? spv::CooperativeMatrixLayoutColumnMajorKHR : spv::CooperativeMatrixLayoutRowMajorKHR));
	load->add_id(chain.stride_id);

	if (chain.alignment)
	{
		load->add_literal(spv::MemoryAccessAlignedMask);
		load->add_literal(chain.alignment);
	}

	impl.add(load);

	// Workaround AGS omitting barriers.
	if (impl.ags.active_uav_op == DXIL::Op::AtomicBinOp)
		emit_subgroup_barrier(impl);

	if (!emit_wmma_return_values(impl, type_id, load->id, 2))
	{
		LOGE("Failed to emit WMMA return values.\n");
		return false;
	}

	return true;
}